

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void CEditor::EnvelopeEval(float TimeOffset,int Env,float *pChannels,void *pUser)

{
  int iVar1;
  CEnvelope **ppCVar2;
  CEnvelope *in_RDX;
  undefined4 *in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  float t;
  CEnvelope *e;
  CEditor *pThis;
  int iVar3;
  
  if ((-1 < in_EDI) &&
     (iVar3 = in_EDI,
     iVar1 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::size
                       ((array<CEnvelope_*,_allocator_default<CEnvelope_*>_> *)
                        (in_RDX[0x41].m_aName + 0x10)), iVar3 < iVar1)) {
    ppCVar2 = array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::operator[]
                        ((array<CEnvelope_*,_allocator_default<CEnvelope_*>_> *)
                         (in_RDX[0x41].m_aName + 0x10),in_EDI);
    CEnvelope::Eval(in_RDX,(float)((ulong)*ppCVar2 >> 0x20),
                    (float *)CONCAT44(*(float *)(in_RDX[0x3b].m_aName + 0x14) *
                                      (*(float *)(in_RDX[0x3b].m_aName + 0x10) + in_XMM0_Da),iVar3))
    ;
    return;
  }
  *in_RSI = 0;
  in_RSI[1] = 0;
  in_RSI[2] = 0;
  in_RSI[3] = 0;
  return;
}

Assistant:

void CEditor::EnvelopeEval(float TimeOffset, int Env, float *pChannels, void *pUser)
{
	CEditor *pThis = (CEditor *)pUser;
	if(Env < 0 || Env >= pThis->m_Map.m_lEnvelopes.size())
	{
		pChannels[0] = 0;
		pChannels[1] = 0;
		pChannels[2] = 0;
		pChannels[3] = 0;
		return;
	}

	CEnvelope *e = pThis->m_Map.m_lEnvelopes[Env];
	float t = pThis->m_AnimateTime+TimeOffset;
	t *= pThis->m_AnimateSpeed;
	e->Eval(t, pChannels);
}